

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satsolver.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Result RVar1;
  GetOpt_pp *pGVar2;
  ostream *poVar3;
  expression *a;
  int iVar4;
  char *pcVar5;
  bool terminal_flag;
  int mode;
  allocator local_254;
  allocator local_253;
  allocator local_252;
  allocator local_251;
  string output_file_string;
  string input_file_string;
  OptionPresent local_210;
  _OptionTBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d8;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  _OptionTBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  _OptionTBase<int> local_e8;
  GetOpt_pp optparser;
  
  GetOpt::GetOpt_pp::GetOpt_pp(&optparser,argc,argv);
  std::__cxx11::string::string((string *)&input_file_string,"input.txt",(allocator *)&local_210);
  std::__cxx11::string::string((string *)&output_file_string,"output.txt",(allocator *)&local_210);
  mode = 0;
  std::__cxx11::string::string((string *)&local_1d8,"help",(allocator *)&local_120);
  GetOpt::OptionPresent::OptionPresent(&local_210,'h',(string *)&local_1d8);
  pGVar2 = GetOpt::GetOpt_pp::operator>>(&optparser,&local_210.super__Option);
  RVar1 = pGVar2->_last;
  GetOpt::OptionPresent::~OptionPresent(&local_210);
  std::__cxx11::string::~string((string *)&local_1d8);
  if (RVar1 == OK) {
    std::operator<<((ostream *)&std::cout,(string *)&help_string_abi_cxx11_);
    goto LAB_00103b50;
  }
  std::__cxx11::string::string((string *)&local_140,"terminal",&local_251);
  GetOpt::OptionPresent::OptionPresent(&local_210,'t',&local_140,&terminal_flag);
  pGVar2 = GetOpt::GetOpt_pp::operator>>(&optparser,&local_210.super__Option);
  std::__cxx11::string::string((string *)&local_160,"input",&local_252);
  GetOpt::_OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_OptionT((_OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1d8,'i',&local_160,&input_file_string);
  pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,&local_1d8.super__Option);
  std::__cxx11::string::string((string *)&local_180,"output",&local_253);
  GetOpt::_OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_OptionT((_OptionT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120,'o',&local_180,&output_file_string);
  pGVar2 = GetOpt::GetOpt_pp::operator>>(pGVar2,&local_120.super__Option);
  std::__cxx11::string::string((string *)&local_1a0,"mode",&local_254);
  GetOpt::_OptionT<int>::_OptionT((_OptionT<int> *)&local_e8,'m',&local_1a0,&mode);
  GetOpt::GetOpt_pp::operator>>(pGVar2,&local_e8.super__Option);
  GetOpt::_OptionTBase<int>::~_OptionTBase(&local_e8);
  std::__cxx11::string::~string((string *)&local_1a0);
  GetOpt::
  _OptionTBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~_OptionTBase(&local_120);
  std::__cxx11::string::~string((string *)&local_180);
  GetOpt::
  _OptionTBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~_OptionTBase(&local_1d8);
  std::__cxx11::string::~string((string *)&local_160);
  GetOpt::OptionPresent::~OptionPresent(&local_210);
  std::__cxx11::string::~string((string *)&local_140);
  poVar3 = std::operator<<((ostream *)&std::cout,"Terminal Mode: ");
  poVar3 = std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Input File String: ");
  poVar3 = std::operator<<(poVar3,(string *)&input_file_string);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Output File String: ");
  poVar3 = std::operator<<(poVar3,(string *)&output_file_string);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Mode: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,mode);
  std::operator<<(poVar3,"\n");
  std::istream::get();
  a = read_exp_from_file(&input_file_string);
  if (a == (expression *)0x0) {
    pcVar5 = "Had problems reading input expression!\n";
    goto LAB_00103b5b;
  }
  switch(mode) {
  case 0:
    pcVar5 = "Satisfyability Not Implemented\n";
    goto LAB_00103b15;
  case 1:
    CNF_FORM(a);
    break;
  case 2:
    DNF_FORM(a);
    break;
  case 3:
    reduce_associative(a);
    break;
  case 4:
    break;
  case 5:
    negated_standard(a);
    break;
  case 6:
    dual_standard(a);
    break;
  case 7:
    standard_form_raw(a);
    break;
  case 8:
    standard_form(a);
    break;
  case 9:
    pcVar5 = "NANDIFY Not Implemented\n";
    goto LAB_00103b15;
  case 10:
    pcVar5 = "NORIFY Not Implemented\n";
LAB_00103b15:
    std::operator<<((ostream *)&std::cout,pcVar5);
    pcVar5 = "Had problems creating output expression!\n";
LAB_00103b5b:
    std::operator<<((ostream *)&std::cout,pcVar5);
    iVar4 = 1;
    goto LAB_00103b6a;
  default:
    pcVar5 = "Invalid Mode! Use -h or --help for more information!\n";
    goto LAB_00103b5b;
  }
  write_exp_to_file(a,&output_file_string,terminal_flag);
  std::istream::get();
LAB_00103b50:
  iVar4 = 0;
LAB_00103b6a:
  std::__cxx11::string::~string((string *)&output_file_string);
  std::__cxx11::string::~string((string *)&input_file_string);
  GetOpt::GetOpt_pp::~GetOpt_pp(&optparser);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[]){

	GetOpt::GetOpt_pp optparser(argc, argv);
	std::string input_file_string = "input.txt",
		output_file_string = "output.txt";
	bool terminal_flag;
	int mode = 0;

	// If the help flag is set, then we don't actually do any work!
	if (optparser >> GetOpt::OptionPresent('h', "help")) {
		std::cout << help_string;
		return 0;
	}

	// Not providing the option should leave input file strings alone
	// Gonna do some testing now
	optparser >> GetOpt::OptionPresent('t', "terminal", terminal_flag)
		>> GetOpt::Option('i', "input", input_file_string)
		>> GetOpt::Option('o', "output", output_file_string)
		>> GetOpt::Option('m', "mode", mode);

#ifdef DEBUG_INPUT_PARSE
	std::cout << "Terminal Mode: " << terminal_flag << "\n"
		<< "Input File String: " << input_file_string << "\n"
		<< "Output File String: " << output_file_string << "\n"
		<< "Mode: " << mode << "\n";
	std::cin.get();
#endif // DEBUG_INPUT_PARSE

	// Read in from the input file
	expression* in_exp = read_exp_from_file(input_file_string);
	expression* out_exp = NULL;
	
	if (in_exp == NULL) {
		std::cout << "Had problems reading input expression!\n";
		return 1;
	}

	/*
		Convert the input expression into an output expression,
		These are all implemented in satform
	*/
	switch (mode) {
	case 0:
		std::cout << "Satisfyability Not Implemented\n";
		break;
	case 1:
		CNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 2:
		DNF_FORM(in_exp);
		out_exp = in_exp;
		break;
	case 3:
		reduce_associative(in_exp);
		out_exp = in_exp;
		break;
	case 4:
		out_exp = in_exp;
		break;
	case 5:
		negated_standard(in_exp);
		out_exp = in_exp;
		break;
	case 6:
		dual_standard(in_exp);
		out_exp = in_exp;
		break;
	case 7:
		standard_form_raw(in_exp);
		out_exp = in_exp;
		break;
	case 8:
		standard_form(in_exp);
		out_exp = in_exp;
		break;
	case 9:
		std::cout << "NANDIFY Not Implemented\n";
		break;
	case 10:
		std::cout << "NORIFY Not Implemented\n"; 
		break;
	default:
		std::cout << "Invalid Mode! Use -h or --help for more information!\n";
		return 1;
	}

	if (out_exp == NULL) {
		std::cout << "Had problems creating output expression!\n";
		return 1;
	}

	write_exp_to_file(out_exp, output_file_string, terminal_flag);

	std::cin.get();
	return 0;
}